

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epanet3.cpp
# Opt level: O0

int EN_cloneProject(EN_Project pClone,EN_Project pSource)

{
  bool bVar1;
  char *pcVar2;
  ENerror *e;
  string local_48 [8];
  string tmpFile;
  int err;
  EN_Project pSource_local;
  EN_Project pClone_local;
  
  if ((pSource == (EN_Project)0x0) || (pClone == (EN_Project)0x0)) {
    pClone_local._4_4_ = 0x66;
  }
  else {
    std::__cxx11::string::string(local_48);
    bVar1 = Utilities::getTmpFileName((string *)local_48);
    if (bVar1) {
      pcVar2 = (char *)std::__cxx11::string::c_str();
      EN_saveProject(pcVar2,pSource);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      EN_loadProject(pcVar2,pClone);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      remove(pcVar2);
      pClone_local._4_4_ = 0;
    }
    else {
      pClone_local._4_4_ = 0xd0;
    }
    std::__cxx11::string::~string(local_48);
  }
  return pClone_local._4_4_;
}

Assistant:

int EN_cloneProject(EN_Project pClone, EN_Project pSource)
{
    if ( pSource == nullptr || pClone == nullptr ) return 102;
    int err = 0;
    std::string tmpFile;
    if ( Utilities::getTmpFileName(tmpFile) )
    {
        try
        {
            EN_saveProject(tmpFile.c_str(), pSource);
            EN_loadProject(tmpFile.c_str(), pClone);
        }
        catch (ENerror const& e)
        {
	        project(pSource)->writeMsg(e.msg);
            err = e.code;
  	    }
        catch (...)
        {
            err = 208; //Unspecified error
        }
        if ( err > 0 )
        {
            EN_clearProject(pClone);
        }
        remove(tmpFile.c_str());
        return err;
    }
    return 208;
}